

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O0

uintmax_t anon_unknown.dwarf_522f::remove_all_aux(path *p,file_type type,error_code *ec)

{
  type tVar1;
  file_type type_00;
  pointer pdVar2;
  path *ppVar3;
  unspecified_bool_type p_Var4;
  uintmax_t uVar5;
  int local_50;
  file_type tmp_type;
  undefined1 local_40 [8];
  directory_iterator itr;
  uintmax_t count;
  error_code *ec_local;
  file_type type_local;
  path *p_local;
  
  itr.m_imp.pn.pi_ = (sp_counted_base *)0x1;
  if (type == directory_file) {
    boost::filesystem::directory_iterator::directory_iterator((directory_iterator *)local_40,p);
    while (tVar1 = boost::iterators::operator!=
                             ((iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                               *)local_40,
                              (iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                               *)(anonymous_namespace)::end_dir_itr), tVar1) {
      pdVar2 = boost::iterators::detail::
               iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
               ::operator->((iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                             *)local_40);
      ppVar3 = boost::filesystem::directory_entry::path(pdVar2);
      type_00 = query_file_type(ppVar3,ec);
      if ((ec != (error_code *)0x0) &&
         (p_Var4 = boost::system::error_code::operator_cast_to_function_pointer(ec),
         p_Var4 != (unspecified_bool_type)0x0)) {
        p_local = (path *)itr.m_imp.pn.pi_;
        local_50 = 1;
        goto LAB_001150b5;
      }
      pdVar2 = boost::iterators::detail::
               iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
               ::operator->((iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                             *)local_40);
      ppVar3 = boost::filesystem::directory_entry::path(pdVar2);
      uVar5 = remove_all_aux(ppVar3,type_00,ec);
      itr.m_imp.pn.pi_ =
           (sp_counted_base *)((long)&(itr.m_imp.pn.pi_)->_vptr_sp_counted_base + uVar5);
      boost::iterators::detail::
      iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
      ::operator++((iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                    *)local_40);
    }
    local_50 = 2;
LAB_001150b5:
    boost::filesystem::directory_iterator::~directory_iterator((directory_iterator *)local_40);
    if (local_50 == 1) {
      return (uintmax_t)p_local;
    }
  }
  remove_file_or_directory(p,type,ec);
  return (uintmax_t)itr.m_imp.pn.pi_;
}

Assistant:

boost::uintmax_t remove_all_aux(const path& p, fs::file_type type,
    error_code* ec)
  {
    boost::uintmax_t count = 1;

    if (type == fs::directory_file)  // but not a directory symlink
    {
      for (fs::directory_iterator itr(p);
            itr != end_dir_itr; ++itr)
      {
        fs::file_type tmp_type = query_file_type(itr->path(), ec);
        if (ec != 0 && *ec)
          return count;
        count += remove_all_aux(itr->path(), tmp_type, ec);
      }
    }
    remove_file_or_directory(p, type, ec);
    return count;
  }